

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O2

void intgemm::kernel_write_test<(intgemm::CPUType)4,float>(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float local_f4 [3];
  AlignedVector<float> output;
  AlignedVector<float> input;
  SourceLineInfo local_c8;
  StringRef local_b8;
  BinaryExpr<const_float_&,_const_float_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  if (3 < kCPU) {
    AlignedVector<float>::AlignedVector(&input,0x10,0x40);
    AlignedVector<float>::AlignedVector(&output,0x10,0x40);
    fVar10 = 0.0;
    for (lVar8 = 0; input.size_ << 2 != lVar8; lVar8 = lVar8 + 4) {
      *(float *)((long)input.mem_ + lVar8) = fVar10;
      fVar10 = fVar10 + 1.0;
    }
    uVar1 = *(undefined8 *)(input.mem_ + 2);
    uVar2 = *(undefined8 *)(input.mem_ + 4);
    uVar3 = *(undefined8 *)(input.mem_ + 6);
    uVar4 = *(undefined8 *)(input.mem_ + 8);
    uVar5 = *(undefined8 *)(input.mem_ + 10);
    uVar6 = *(undefined8 *)(input.mem_ + 0xc);
    uVar7 = *(undefined8 *)(input.mem_ + 0xe);
    *(undefined8 *)output.mem_ = *(undefined8 *)input.mem_;
    *(undefined8 *)(output.mem_ + 2) = uVar1;
    *(undefined8 *)(output.mem_ + 4) = uVar2;
    *(undefined8 *)(output.mem_ + 6) = uVar3;
    *(undefined8 *)(output.mem_ + 8) = uVar4;
    *(undefined8 *)(output.mem_ + 10) = uVar5;
    *(undefined8 *)(output.mem_ + 0xc) = uVar6;
    *(undefined8 *)(output.mem_ + 0xe) = uVar7;
    lVar9 = 0;
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_a8.super_ITransientExpression.m_isBinaryExpression = true;
      local_a8.super_ITransientExpression.m_result = false;
      local_a8.super_ITransientExpression._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
      ;
      local_c8.line = 0x1c;
      Catch::StringRef::StringRef(&local_b8,"output[i] == ElemType_(i)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_a8,&local_c8,local_b8,ContinueOnFailure)
      ;
      local_c8.file = (char *)((long)output.mem_ + lVar9);
      local_f4[0] = (float)lVar8;
      Catch::ExprLhs<float_const&>::operator==
                (&local_a8,(ExprLhs<float_const&> *)&local_c8,local_f4);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_a8.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      lVar9 = lVar9 + 4;
    }
    free(output.mem_);
    free(input.mem_);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}